

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O0

void __thiscall
dg::LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
          (LLVMControlDependenceAnalysis *this,Module *module,
          LLVMControlDependenceAnalysisOptions *opts,LLVMPointerAnalysis *pta)

{
  CallGraph *in_RCX;
  LLVMControlDependenceAnalysisOptions *in_RDX;
  _func_int **in_RSI;
  LLVMPointerAnalysis *in_RDI;
  LLVMControlDependenceAnalysisOptions *in_stack_ffffffffffffffc8;
  
  in_RDI->_vptr_LLVMPointerAnalysis = in_RSI;
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            (in_RDX,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<dg::LLVMControlDependenceAnalysisImpl,std::default_delete<dg::LLVMControlDependenceAnalysisImpl>>
  ::unique_ptr<std::default_delete<dg::LLVMControlDependenceAnalysisImpl>,void>
            ((unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
              *)in_RDX,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<dg::LLVMControlDependenceAnalysisImpl,std::default_delete<dg::LLVMControlDependenceAnalysisImpl>>
  ::unique_ptr<std::default_delete<dg::LLVMControlDependenceAnalysisImpl>,void>
            ((unique_ptr<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
              *)in_RDX,in_stack_ffffffffffffffc8);
  dg::LLVMControlDependenceAnalysis::initializeImpl(in_RDI,in_RCX);
  return;
}

Assistant:

LLVMControlDependenceAnalysis(const llvm::Module *module,
                                  LLVMControlDependenceAnalysisOptions opts,
                                  LLVMPointerAnalysis *pta = nullptr)
            : _module(module), _options(std::move(opts)) {
        initializeImpl(pta);
    }